

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qunicodetools.cpp
# Opt level: O2

void QUnicodeTools::Tailored::thaiAttributes
               (Script script,char16_t *text,qsizetype from,qsizetype len,
               QCharAttributes *attributes)

{
  char16_t cVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  QFunctionPointer p_Var5;
  ulong uVar6;
  QCharAttributes *pQVar7;
  long lVar8;
  long lVar9;
  char16_t cVar10;
  long lVar11;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  undefined2 local_30b;
  undefined1 local_309;
  QArrayDataPointer<char16_t> local_308;
  QVarLengthArray<int,_128LL> break_positions;
  QVarLengthArray<char,_129LL> s;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&s,0xaa,0xa0);
  QVarLengthArray<char,_129LL>::QVarLengthArray(&s,len + 1);
  memset(&break_positions,0xaa,0x218);
  QVarLengthArray<int,_128LL>::QVarLengthArray(&break_positions,len);
  local_30b = 0xaaaa;
  local_309 = 0xaa;
  if (-2 < (char)QtGlobalStatic::
                 Holder<QUnicodeTools::Tailored::(anonymous_namespace)::Q_QGS_g_libThai>::guard.
                 _q_value.super___atomic_base<signed_char>._M_i) {
    if ((QGlobalStatic<QtGlobalStatic::Holder<QUnicodeTools::Tailored::(anonymous_namespace)::Q_QGS_g_libThai>>
         ::instance()::holder == '\0') &&
       (iVar3 = __cxa_guard_acquire(&QGlobalStatic<QtGlobalStatic::Holder<QUnicodeTools::Tailored::(anonymous_namespace)::Q_QGS_g_libThai>>
                                     ::instance()::holder), iVar3 != 0)) {
      latin1.m_data = "thai";
      latin1.m_size = 4;
      QString::QString((QString *)&local_308,latin1);
      QLibrary::QLibrary((QLibrary *)
                         QGlobalStatic<QtGlobalStatic::Holder<QUnicodeTools::Tailored::(anonymous_namespace)::Q_QGS_g_libThai>>
                         ::instance()::holder,(QString *)&local_308,0,(QObject *)0x0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_308);
      QGlobalStatic<QtGlobalStatic::Holder<QUnicodeTools::Tailored::(anonymous_namespace)::Q_QGS_g_libThai>>
      ::instance()::holder._24_8_ = 0;
      QGlobalStatic<QtGlobalStatic::Holder<QUnicodeTools::Tailored::(anonymous_namespace)::Q_QGS_g_libThai>>
      ::instance()::holder._32_8_ = 0;
      QGlobalStatic<QtGlobalStatic::Holder<QUnicodeTools::Tailored::(anonymous_namespace)::Q_QGS_g_libThai>>
      ::instance()::holder._40_8_ = 0;
      QGlobalStatic<QtGlobalStatic::Holder<QUnicodeTools::Tailored::(anonymous_namespace)::Q_QGS_g_libThai>>
      ::instance()::holder._48_8_ = 0;
      QGlobalStatic<QtGlobalStatic::Holder<QUnicodeTools::Tailored::(anonymous_namespace)::Q_QGS_g_libThai>>
      ::instance()::holder._32_8_ =
           QLibrary::resolve((QLibrary *)
                             QGlobalStatic<QtGlobalStatic::Holder<QUnicodeTools::Tailored::(anonymous_namespace)::Q_QGS_g_libThai>>
                             ::instance()::holder,"th_brk_find_breaks");
      QGlobalStatic<QtGlobalStatic::Holder<QUnicodeTools::Tailored::(anonymous_namespace)::Q_QGS_g_libThai>>
      ::instance()::holder._40_8_ =
           QLibrary::resolve((QLibrary *)
                             QGlobalStatic<QtGlobalStatic::Holder<QUnicodeTools::Tailored::(anonymous_namespace)::Q_QGS_g_libThai>>
                             ::instance()::holder,"th_next_cell");
      p_Var5 = QLibrary::resolve((QLibrary *)
                                 QGlobalStatic<QtGlobalStatic::Holder<QUnicodeTools::Tailored::(anonymous_namespace)::Q_QGS_g_libThai>>
                                 ::instance()::holder,"th_brk_new");
      if (p_Var5 != (QFunctionPointer)0x0) {
        QGlobalStatic<QtGlobalStatic::Holder<QUnicodeTools::Tailored::(anonymous_namespace)::Q_QGS_g_libThai>>
        ::instance()::holder._24_8_ = (*p_Var5)(0);
        QGlobalStatic<QtGlobalStatic::Holder<QUnicodeTools::Tailored::(anonymous_namespace)::Q_QGS_g_libThai>>
        ::instance()::holder._48_8_ =
             QLibrary::resolve((QLibrary *)
                               QGlobalStatic<QtGlobalStatic::Holder<QUnicodeTools::Tailored::(anonymous_namespace)::Q_QGS_g_libThai>>
                               ::instance()::holder,"th_brk_delete");
      }
      QtGlobalStatic::Holder<QUnicodeTools::Tailored::(anonymous_namespace)::Q_QGS_g_libThai>::guard
      ._q_value.super___atomic_base<signed_char>._M_i = (Type)(__atomic_base<signed_char>)0xff;
      __cxa_atexit(QtGlobalStatic::
                   Holder<QUnicodeTools::Tailored::(anonymous_namespace)::Q_QGS_g_libThai>::~Holder,
                   QGlobalStatic<QtGlobalStatic::Holder<QUnicodeTools::Tailored::(anonymous_namespace)::Q_QGS_g_libThai>>
                   ::instance()::holder,&__dso_handle);
      __cxa_guard_release(&QGlobalStatic<QtGlobalStatic::Holder<QUnicodeTools::Tailored::(anonymous_namespace)::Q_QGS_g_libThai>>
                           ::instance()::holder);
    }
    if (((QGlobalStatic<QtGlobalStatic::Holder<QUnicodeTools::Tailored::(anonymous_namespace)::Q_QGS_g_libThai>>
          ::instance()::holder._32_8_ != 0) &&
        (QGlobalStatic<QtGlobalStatic::Holder<QUnicodeTools::Tailored::(anonymous_namespace)::Q_QGS_g_libThai>>
         ::instance()::holder._40_8_ != 0)) &&
       (QGlobalStatic<QtGlobalStatic::Holder<QUnicodeTools::Tailored::(anonymous_namespace)::Q_QGS_g_libThai>>
        ::instance()::holder._24_8_ != 0)) {
      pQVar7 = attributes + from;
      lVar8 = 0;
      lVar11 = 0;
      if (0 < len) {
        lVar11 = len;
      }
      for (; lVar11 != lVar8; lVar8 = lVar8 + 1) {
        cVar1 = text[from + lVar8];
        cVar10 = cVar1 + L'ﾠ' & 0xff;
        if (0x5a < (ushort)(cVar1 + L'\xf1ff')) {
          cVar10 = L'ÿ';
        }
        if ((ushort)cVar1 < 0xa1) {
          cVar10 = cVar1;
        }
        *(char *)((long)s.super_QVLABase<char>.super_QVLABaseBase.ptr + lVar8) = (char)cVar10;
      }
      *(undefined1 *)((long)s.super_QVLABase<char>.super_QVLABaseBase.ptr + len) = 0;
      for (lVar8 = 0; lVar11 != lVar8; lVar8 = lVar8 + 1) {
        pQVar7[lVar8] = (QCharAttributes)((byte)pQVar7[lVar8] & 0x95);
      }
      *pQVar7 = (QCharAttributes)((byte)*pQVar7 & 0x9d | 0x22);
      iVar3 = (*(code *)QGlobalStatic<QtGlobalStatic::Holder<QUnicodeTools::Tailored::(anonymous_namespace)::Q_QGS_g_libThai>>
                        ::instance()::holder._32_8_)
                        (QGlobalStatic<QtGlobalStatic::Holder<QUnicodeTools::Tailored::(anonymous_namespace)::Q_QGS_g_libThai>>
                         ::instance()::holder._24_8_,s.super_QVLABase<char>.super_QVLABaseBase.ptr,
                         break_positions.super_QVLABase<int>.super_QVLABaseBase.ptr,
                         break_positions.super_QVLABase<int>.super_QVLABaseBase.s);
      lVar8 = (long)iVar3;
      lVar9 = 0;
      lVar11 = 0;
      if (0 < lVar8) {
        lVar11 = lVar8;
      }
      for (; lVar11 != lVar9; lVar9 = lVar9 + 1) {
        pQVar7[*(int *)((long)break_positions.super_QVLABase<int>.super_QVLABaseBase.ptr + lVar9 * 4
                       )] =
             (QCharAttributes)
             ((byte)pQVar7[*(int *)((long)break_positions.super_QVLABase<int>.super_QVLABaseBase.ptr
                                   + lVar9 * 4)] | 2);
        pQVar7[*(int *)((long)break_positions.super_QVLABase<int>.super_QVLABaseBase.ptr + lVar9 * 4
                       )] =
             (QCharAttributes)
             ((byte)pQVar7[*(int *)((long)break_positions.super_QVLABase<int>.super_QVLABaseBase.ptr
                                   + lVar9 * 4)] | 0x20);
        pQVar7[*(int *)((long)break_positions.super_QVLABase<int>.super_QVLABaseBase.ptr + lVar9 * 4
                       )] =
             (QCharAttributes)
             ((byte)pQVar7[*(int *)((long)break_positions.super_QVLABase<int>.super_QVLABaseBase.ptr
                                   + lVar9 * 4)] | 0x40);
        pQVar7[*(int *)((long)break_positions.super_QVLABase<int>.super_QVLABaseBase.ptr + lVar9 * 4
                       )] =
             (QCharAttributes)
             ((byte)pQVar7[*(int *)((long)break_positions.super_QVLABase<int>.super_QVLABaseBase.ptr
                                   + lVar9 * 4)] | 8);
      }
      if (0 < iVar3) {
        pQVar7[*(int *)((long)break_positions.super_QVLABase<int>.super_QVLABaseBase.ptr +
                       lVar8 * 4 + -4)] =
             (QCharAttributes)
             ((byte)pQVar7[*(int *)((long)break_positions.super_QVLABase<int>.super_QVLABaseBase.ptr
                                   + lVar8 * 4 + -4)] & 0xdf);
      }
      for (lVar11 = 0; len - lVar11 != 0 && lVar11 <= len; lVar11 = lVar11 + uVar4) {
        uVar4 = (*(code *)QGlobalStatic<QtGlobalStatic::Holder<QUnicodeTools::Tailored::(anonymous_namespace)::Q_QGS_g_libThai>>
                          ::instance()::holder._40_8_)
                          ((long)s.super_QVLABase<char>.super_QVLABaseBase.ptr + lVar11,len - lVar11
                           ,&local_30b,1);
        pQVar7[lVar11] = (QCharAttributes)((byte)pQVar7[lVar11] | 1);
        for (uVar6 = 1; uVar6 < uVar4; uVar6 = uVar6 + 1) {
          pQVar7[uVar6 + lVar11] = (QCharAttributes)((byte)pQVar7[uVar6 + lVar11] & 0xfe);
        }
      }
    }
  }
  QVarLengthArray<int,_128LL>::~QVarLengthArray(&break_positions);
  QVarLengthArray<char,_129LL>::~QVarLengthArray(&s);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void thaiAttributes(QChar::Script script, const char16_t *text, qsizetype from, qsizetype len, QCharAttributes *attributes)
{
    assert(script == QChar::Script_Thai);
#if QT_CONFIG(library)
    const char16_t *uc = text + from;
    attributes += from;
    Q_UNUSED(script);
    thaiAssignAttributes(uc, len, attributes);
#else
    Q_UNUSED(script);
    Q_UNUSED(text);
    Q_UNUSED(from);
    Q_UNUSED(len);
    Q_UNUSED(attributes);
#endif
}